

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDefinitions
          (MessageGenerator *this,Printer *p)

{
  Options *options;
  bool bVar1;
  value_type field;
  OneofDescriptor *pOVar2;
  FieldGenerator *this_00;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  TypeErasedState local_98;
  code *local_88;
  code *local_80;
  Iterator __begin3;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_68;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:684:30)>
  accessor_verifier;
  Iterator __end3;
  
  io::Printer::Emit(p,0x10,"// $classname$\n\n");
  __begin3.descriptor = this->descriptor_;
  __begin3.idx = 0;
  __end3.idx = (__begin3.descriptor)->field_count_;
  options = &this->options_;
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    bVar1 = protobuf::internal::operator!=(&__begin3,&__end3);
    if (!bVar1) break;
    field = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                      (&__begin3);
    v.storage_._0_8_ = v.storage_._0_8_ & 0xffffffffffff0000;
    v.storage_.callback_buffer_._0_8_ = field;
    local_98.remote.target = operator_new(0x18);
    *(undefined8 *)((long)local_98.remote.target + 0x10) = v.storage_.callback_buffer_._8_8_;
    *(undefined8 *)local_98.remote.target = v.storage_._0_8_;
    *(undefined8 *)((long)local_98.remote.target + 8) = v.storage_.callback_buffer_._0_8_;
    local_88 = absl::lts_20250127::internal_any_invocable::
               RemoteManagerNontrivial<google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier>
    ;
    local_80 = absl::lts_20250127::internal_any_invocable::
               RemoteInvoker<false,void,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier&,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation>
    ;
    io::Printer::WithSubstitutionListener
              (&accessor_verifier,p,
               (AnyInvocable<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
                *)&local_98.remote);
    (*local_88)(dispose,&local_98,&local_98);
    cpp::anon_unknown_0::AccessorVerifier::~AccessorVerifier((AccessorVerifier *)&v);
    v.storage_.callback_buffer_[0] = '\0';
    v.storage_.callback_buffer_[1] = '\0';
    v.storage_.callback_buffer_[2] = '\0';
    v.storage_.callback_buffer_[3] = '\0';
    v.storage_.callback_buffer_[4] = '\0';
    v.storage_.callback_buffer_[5] = '\0';
    v.storage_.callback_buffer_[6] = '\0';
    v.storage_.callback_buffer_[7] = '\0';
    v.storage_.callback_buffer_[8] = '\0';
    v.storage_.callback_buffer_[9] = '\0';
    v.storage_.callback_buffer_[10] = '\0';
    v.storage_.callback_buffer_[0xb] = '\0';
    v.storage_.callback_buffer_[0xc] = '\0';
    v.storage_.callback_buffer_[0xd] = '\0';
    v.storage_.callback_buffer_[0xe] = '\0';
    v.storage_.callback_buffer_[0xf] = '\0';
    v.storage_._0_8_ = p;
    PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)&v,field,options);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)v.storage_.callback_buffer_);
    FieldVars((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)&t,field,options);
    vars.len_ = (long)(t.storage_.callback_buffer_._0_8_ - t.storage_._0_8_) / 0xb8;
    vars.ptr_ = (pointer)t.storage_._0_8_;
    io::Printer::WithVars(&v,p,vars);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)&t);
    MakeTrackerCalls(&local_68,field,options);
    vars_00.len_ = ((long)local_68.
                          super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_68.
                         super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0xb8;
    vars_00.ptr_ = local_68.
                   super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    io::Printer::WithVars(&t,p,vars_00);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_68);
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      io::Printer::Emit(p,0x140,
                        "\n        inline int $classname$::_internal_$name_internal$_size() const {\n          return _internal_$name_internal$().size();\n        }\n        inline int $classname$::$name$_size() const {\n          $WeakDescriptorSelfPin$;\n          $annotate_size$;\n          return _internal_$name_internal$_size();\n        }\n      "
                       );
    }
    else {
      pOVar2 = FieldDescriptor::real_containing_oneof(field);
      if (pOVar2 == (OneofDescriptor *)0x0) {
        GenerateSingularFieldHasBits(this,field,p);
      }
      else {
        GenerateOneofMemberHasBits(this,field,p);
      }
    }
    bVar1 = cpp::anon_unknown_0::IsCrossFileMaybeMap(field);
    if (!bVar1) {
      GenerateFieldClear(this,field,true,p);
    }
    this_00 = FieldGeneratorTable::get(&this->field_generators_,field);
    FieldGenerator::GenerateInlineAccessorDefinitions(this_00,p);
    io::Printer::Emit(p,1,"\n");
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&t);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&v);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:684:30)>
    ::~Cleanup(&accessor_verifier);
    __begin3.idx = __begin3.idx + 1;
  }
  GenerateOneofHasBits(this,p);
  return;
}

Assistant:

void MessageGenerator::GenerateFieldAccessorDefinitions(io::Printer* p) {
  p->Emit("// $classname$\n\n");

  for (auto field : FieldRange(descriptor_)) {
    // We use a print listener to verify that the field generators properly add
    // the right annotations. This is only a verification step aimed to prevent
    // bugs where we have lack of test coverage. Note that this will verify the
    // annotations even when the particular feature is not on because we look at
    // the substitution variables, not the substitution result.
    // The check is a state machine that verifies that every substitution for
    // `name` is followed by one and only one for needed annotations. False
    // positives are accessors that are using $name$ for an internal name. For
    // those you can use $name_internal$ which is the same substitution but not
    // tracked by the verifier.
    const auto accessor_verifier =
        p->WithSubstitutionListener(AccessorVerifier(field));

    PrintFieldComment(Formatter{p}, field, options_);

    auto v = p->WithVars(FieldVars(field, options_));
    auto t = p->WithVars(MakeTrackerCalls(field, options_));
    if (field->is_repeated()) {
      p->Emit(R"cc(
        inline int $classname$::_internal_$name_internal$_size() const {
          return _internal_$name_internal$().size();
        }
        inline int $classname$::$name$_size() const {
          $WeakDescriptorSelfPin$;
          $annotate_size$;
          return _internal_$name_internal$_size();
        }
      )cc");
    } else if (field->real_containing_oneof()) {
      GenerateOneofMemberHasBits(field, p);
    } else {
      GenerateSingularFieldHasBits(field, p);
    }

    if (!IsCrossFileMaybeMap(field)) {
      GenerateFieldClear(field, true, p);
    }
    // Generate type-specific accessors.
    field_generators_.get(field).GenerateInlineAccessorDefinitions(p);

    p->Emit("\n");
  }

  GenerateOneofHasBits(p);
}